

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int EnsureInitialized(BrotliEncoderState *s)

{
  uint uVar1;
  int in_EAX;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  byte bVar6;
  uint8_t uVar8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  byte bVar7;
  
  if (s->is_initialized_ != 0) {
    return in_EAX;
  }
  iVar2 = (s->params).quality;
  iVar9 = 0;
  if (0 < iVar2) {
    iVar9 = iVar2;
  }
  iVar10 = 0xb;
  if (iVar9 < 0xb) {
    iVar10 = iVar9;
  }
  (s->params).quality = iVar10;
  if (iVar2 < 3) {
    (s->params).large_window = 0;
  }
  iVar9 = (s->params).lgwin;
  iVar10 = 10;
  if (9 < iVar9) {
    iVar10 = 0x1e;
    if ((s->params).large_window == 0) {
      iVar10 = 0x18;
    }
    if (iVar9 <= iVar10) goto LAB_00126b47;
  }
  (s->params).lgwin = iVar10;
LAB_00126b47:
  if (iVar2 < 2) {
    iVar9 = (s->params).lgwin;
  }
  else {
    iVar9 = 0xe;
    if (3 < iVar2) {
      iVar9 = (s->params).lgblock;
      if (iVar9 == 0) {
        iVar9 = 0x10;
        if (((8 < iVar2) && (iVar2 = (s->params).lgwin, 0x10 < iVar2)) &&
           (iVar9 = 0x12, iVar2 < 0x12)) {
          iVar9 = iVar2;
        }
      }
      else {
        iVar2 = 0x10;
        if (0x10 < iVar9) {
          iVar2 = iVar9;
        }
        iVar9 = 0x18;
        if (iVar2 < 0x18) {
          iVar9 = iVar2;
        }
      }
    }
  }
  (s->params).lgblock = iVar9;
  ChooseDistanceParams(&s->params);
  s->remaining_metadata_bytes_ = 0xffffffff;
  uVar1 = (s->params).quality;
  uVar4 = (s->params).lgwin;
  iVar2 = (s->params).lgblock;
  bVar6 = (byte)iVar2;
  bVar7 = bVar6;
  if (iVar2 < (int)uVar4) {
    bVar7 = (byte)uVar4;
  }
  uVar11 = 1 << (bVar7 + 1 & 0x1f);
  (s->ringbuffer_).size_ = uVar11;
  (s->ringbuffer_).mask_ = uVar11 - 1;
  uVar12 = 1 << (bVar6 & 0x1f);
  (s->ringbuffer_).tail_size_ = uVar12;
  (s->ringbuffer_).total_size_ = uVar12 + uVar11;
  uVar3 = 0x12;
  if (0x12 < (int)uVar4) {
    uVar3 = uVar4;
  }
  if (1 < uVar1) {
    uVar3 = uVar4;
  }
  if ((s->params).large_window == 0) {
    if (uVar3 == 0x10) {
      uVar8 = '\x01';
      uVar4 = 0;
    }
    else if (uVar3 == 0x11) {
      uVar8 = '\a';
      uVar4 = 1;
    }
    else if ((int)uVar3 < 0x12) {
      uVar4 = uVar3 * 0x10 - 0x7f;
      uVar8 = '\a';
    }
    else {
      uVar4 = uVar3 * 2 - 0x21;
      uVar8 = '\x04';
    }
  }
  else {
    uVar4 = (uVar3 & 0x3f) << 8 | 0x11;
    uVar8 = '\x0e';
  }
  s->last_bytes_ = (uint16_t)uVar4;
  s->last_bytes_bits_ = uVar8;
  if (uVar1 == 0) {
    memcpy(s->cmd_depths_,InitCommandPrefixCodes_kDefaultCommandDepths,0x80);
    pvVar5 = memcpy(s->cmd_bits_,InitCommandPrefixCodes_kDefaultCommandBits,0x100);
    uVar4 = (uint)pvVar5;
    s->cmd_code_[0] = 0xff;
    s->cmd_code_[1] = 'w';
    s->cmd_code_[2] = 0xd5;
    s->cmd_code_[3] = 0xbf;
    s->cmd_code_[4] = 0xe7;
    s->cmd_code_[5] = 0xde;
    s->cmd_code_[6] = 0xea;
    s->cmd_code_[7] = 0x9e;
    s->cmd_code_[8] = 'Q';
    s->cmd_code_[9] = ']';
    s->cmd_code_[10] = 0xde;
    s->cmd_code_[0xb] = 0xc6;
    s->cmd_code_[0xc] = 'p';
    s->cmd_code_[0xd] = 'W';
    s->cmd_code_[0xe] = 0xbc;
    s->cmd_code_[0xf] = 'X';
    s->cmd_code_[0x10] = 'X';
    s->cmd_code_[0x11] = 'X';
    s->cmd_code_[0x12] = 0xd8;
    s->cmd_code_[0x13] = 0xd8;
    s->cmd_code_[0x14] = 'X';
    s->cmd_code_[0x15] = 0xd5;
    s->cmd_code_[0x16] = 0xcb;
    s->cmd_code_[0x17] = 0x8c;
    s->cmd_code_[0x18] = 0xea;
    s->cmd_code_[0x19] = 0xe0;
    s->cmd_code_[0x1a] = 0xc3;
    s->cmd_code_[0x1b] = 0x87;
    s->cmd_code_[0x1c] = '\x1f';
    s->cmd_code_[0x1d] = 0x83;
    s->cmd_code_[0x1e] = 0xc1;
    s->cmd_code_[0x1f] = '`';
    s->cmd_code_[0x20] = '\x1c';
    s->cmd_code_[0x21] = 'g';
    s->cmd_code_[0x22] = 0xb2;
    s->cmd_code_[0x23] = 0xaa;
    s->cmd_code_[0x24] = '\x06';
    s->cmd_code_[0x25] = 0x83;
    s->cmd_code_[0x26] = 0xc1;
    s->cmd_code_[0x27] = '`';
    s->cmd_code_[0x28] = '0';
    s->cmd_code_[0x29] = '\x18';
    s->cmd_code_[0x2a] = 0xcc;
    s->cmd_code_[0x2b] = 0xa1;
    s->cmd_code_[0x2c] = 0xce;
    s->cmd_code_[0x2d] = 0x88;
    s->cmd_code_[0x2e] = 'T';
    s->cmd_code_[0x2f] = 0x94;
    s->cmd_code_[0x29] = '\x18';
    s->cmd_code_[0x2a] = 0xcc;
    s->cmd_code_[0x2b] = 0xa1;
    s->cmd_code_[0x2c] = 0xce;
    s->cmd_code_[0x2d] = 0x88;
    s->cmd_code_[0x2e] = 'T';
    s->cmd_code_[0x2f] = 0x94;
    s->cmd_code_[0x30] = 'F';
    s->cmd_code_[0x31] = 0xe1;
    s->cmd_code_[0x32] = 0xb0;
    s->cmd_code_[0x33] = 0xd0;
    s->cmd_code_[0x34] = 'N';
    s->cmd_code_[0x35] = 0xb2;
    s->cmd_code_[0x36] = 0xf7;
    s->cmd_code_[0x37] = '\x04';
    s->cmd_code_[0x38] = '\0';
    s->cmd_code_numbits_ = 0x1c0;
  }
  s->is_initialized_ = 1;
  return uVar4;
}

Assistant:

static BROTLI_BOOL EnsureInitialized(BrotliEncoderState* s) {
  if (BROTLI_IS_OOM(&s->memory_manager_)) return BROTLI_FALSE;
  if (s->is_initialized_) return BROTLI_TRUE;

  SanitizeParams(&s->params);
  s->params.lgblock = ComputeLgBlock(&s->params);
  ChooseDistanceParams(&s->params);

  s->remaining_metadata_bytes_ = BROTLI_UINT32_MAX;

  RingBufferSetup(&s->params, &s->ringbuffer_);

  /* Initialize last byte with stream header. */
  {
    int lgwin = s->params.lgwin;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
        s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
      lgwin = BROTLI_MAX(int, lgwin, 18);
    }
    EncodeWindowBits(lgwin, s->params.large_window,
                     &s->last_bytes_, &s->last_bytes_bits_);
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    InitCommandPrefixCodes(s->cmd_depths_, s->cmd_bits_,
                           s->cmd_code_, &s->cmd_code_numbits_);
  }

  s->is_initialized_ = BROTLI_TRUE;
  return BROTLI_TRUE;
}